

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O0

void __thiscall
Pl_Function::Pl_Function
          (Pl_Function *this,char *identifier,Pipeline *next,writer_c_t fn,void *udata)

{
  function<void(unsigned_char_const*,unsigned_long)> *this_00;
  anon_class_24_3_cbc5c5a7 local_60;
  undefined8 local_38;
  void *local_30;
  void *udata_local;
  writer_c_t fn_local;
  Pipeline *next_local;
  char *identifier_local;
  Pl_Function *this_local;
  
  local_30 = udata;
  udata_local = fn;
  fn_local = (writer_c_t)next;
  next_local = (Pipeline *)identifier;
  identifier_local = (char *)this;
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Function_0058b388;
  local_38 = 0;
  std::make_unique<Pl_Function::Members,decltype(nullptr)>((void **)&this->m);
  local_60.identifier = (char *)next_local;
  local_60.fn = (writer_c_t)udata_local;
  local_60.udata = local_30;
  this_00 = (function<void(unsigned_char_const*,unsigned_long)> *)
            std::unique_ptr<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>::
            operator->(&this->m);
  std::function<void(unsigned_char_const*,unsigned_long)>::operator=(this_00,&local_60);
  return;
}

Assistant:

Pl_Function::Pl_Function(char const* identifier, Pipeline* next, writer_c_t fn, void* udata) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(nullptr))
{
    m->fn = [identifier, fn, udata](unsigned char const* data, size_t len) {
        int code = fn(data, len, udata);
        if (code != 0) {
            throw std::runtime_error(
                std::string(identifier) + " function returned code " + std::to_string(code));
        }
    };
}